

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void minmaxFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  sqlite3_context *pCtx;
  Mem *in_RDX;
  int in_ESI;
  sqlite3_context *in_RDI;
  CollSeq *pColl;
  int iBest;
  int mask;
  int i;
  sqlite3_value *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar6;
  
  pvVar5 = sqlite3_user_data(in_RDI);
  uVar1 = 0xffffffff;
  if (pvVar5 == (void *)0x0) {
    uVar1 = 0;
  }
  pCtx = (sqlite3_context *)sqlite3GetFuncCollSeq(in_RDI);
  iVar6 = 0;
  iVar2 = sqlite3_value_type((sqlite3_value *)(in_RDX->u).pDef);
  if (iVar2 != 5) {
    for (iVar2 = 1; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      iVar3 = sqlite3_value_type((sqlite3_value *)(&in_RDX->u)[iVar2].pDef);
      if (iVar3 == 5) {
        return;
      }
      uVar4 = sqlite3MemCompare(in_RDX,(Mem *)CONCAT44(iVar2,uVar1),
                                (CollSeq *)CONCAT44(iVar6,in_stack_ffffffffffffffd8));
      if (-1 < (int)(uVar4 ^ uVar1)) {
        iVar6 = iVar2;
      }
    }
    sqlite3_result_value(pCtx,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void minmaxFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;
  int mask;    /* 0 for min() or 0xffffffff for max() */
  int iBest;
  CollSeq *pColl;

  assert( argc>1 );
  mask = sqlite3_user_data(context)==0 ? 0 : -1;
  pColl = sqlite3GetFuncCollSeq(context);
  assert( pColl );
  assert( mask==-1 || mask==0 );
  iBest = 0;
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  for(i=1; i<argc; i++){
    if( sqlite3_value_type(argv[i])==SQLITE_NULL ) return;
    if( (sqlite3MemCompare(argv[iBest], argv[i], pColl)^mask)>=0 ){
      testcase( mask==0 );
      iBest = i;
    }
  }
  sqlite3_result_value(context, argv[iBest]);
}